

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtbdd.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkDeriveFromBdd(void *dd0,void *bFunc,char *pNamePo,Vec_Ptr_t *vNamesPi)

{
  uint uVar1;
  int iVar2;
  DdNode *pDVar3;
  DdNode *pDVar4;
  Abc_Ntk_t *pNtk;
  char *pcVar5;
  Abc_Obj_t *pAVar6;
  DdNode *pDVar7;
  Vec_Ptr_t *pVVar8;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vNames;
  long lVar9;
  char *s;
  
  s = "F";
  if (pNamePo != (char *)0x0) {
    s = pNamePo;
  }
  if (vNamesPi == (Vec_Ptr_t *)0x0) {
    vNamesPi = Abc_NodeGetFakeNames(*(int *)((long)dd0 + 0x88));
    vNames = vNamesPi;
  }
  else {
    vNames = (Vec_Ptr_t *)0x0;
  }
  pDVar3 = Cudd_Support((DdManager *)dd0,(DdNode *)bFunc);
  Cudd_Ref(pDVar3);
  pDVar4 = Cudd_ReadOne((DdManager *)dd0);
  pDVar7 = pDVar3;
  if (pDVar3 != pDVar4) {
    do {
      uVar1 = Cudd_NodeReadIndex(pDVar7);
      if (vNamesPi->nSize <= (int)uVar1) break;
      pDVar7 = (pDVar7->type).kids.T;
      pDVar4 = Cudd_ReadOne((DdManager *)dd0);
    } while (pDVar7 != pDVar4);
  }
  Cudd_RecursiveDeref((DdManager *)dd0,pDVar3);
  pDVar3 = Cudd_ReadOne((DdManager *)dd0);
  if (pDVar7 == pDVar3) {
    pNtk = Abc_NtkAlloc(ABC_NTK_LOGIC,ABC_FUNC_BDD,1);
    pcVar5 = Extra_UtilStrsav(s);
    pNtk->pName = pcVar5;
    Cudd_bddIthVar((DdManager *)pNtk->pManFunc,vNamesPi->nSize);
    if (0 < vNamesPi->nSize) {
      lVar9 = 0;
      do {
        pcVar5 = (char *)vNamesPi->pArray[lVar9];
        pAVar6 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PI);
        Abc_ObjAssignName(pAVar6,pcVar5,(char *)0x0);
        lVar9 = lVar9 + 1;
      } while (lVar9 < vNamesPi->nSize);
    }
    pAVar6 = Abc_NtkCreateObj(pNtk,ABC_OBJ_NODE);
    pDVar7 = Cudd_bddTransfer((DdManager *)dd0,(DdManager *)pNtk->pManFunc,(DdNode *)bFunc);
    (pAVar6->field_5).pData = pDVar7;
    Cudd_Ref(pDVar7);
    pVVar8 = pNtk->vPis;
    if (0 < pVVar8->nSize) {
      lVar9 = 0;
      do {
        Abc_ObjAddFanin(pAVar6,(Abc_Obj_t *)pVVar8->pArray[lVar9]);
        lVar9 = lVar9 + 1;
        pVVar8 = pNtk->vPis;
      } while (lVar9 < pVVar8->nSize);
    }
    pObj = Abc_NtkCreateObj(pNtk,ABC_OBJ_PO);
    Abc_ObjAddFanin(pObj,pAVar6);
    Abc_ObjAssignName(pObj,s,(char *)0x0);
    Abc_NtkMinimumBase(pNtk);
    if (vNames != (Vec_Ptr_t *)0x0) {
      Abc_NodeFreeNames(vNames);
    }
    iVar2 = Abc_NtkCheck(pNtk);
    if (iVar2 == 0) {
      fwrite("Abc_NtkDeriveFromBdd(): Network check has failed.\n",0x32,1,_stdout);
    }
  }
  else {
    pNtk = (Abc_Ntk_t *)0x0;
  }
  return pNtk;
}

Assistant:

Abc_Ntk_t * Abc_NtkDeriveFromBdd( void * dd0, void * bFunc, char * pNamePo, Vec_Ptr_t * vNamesPi )
{
    DdManager * dd = (DdManager *)dd0;
    Abc_Ntk_t * pNtk; 
    Vec_Ptr_t * vNamesPiFake = NULL;
    Abc_Obj_t * pNode, * pNodePi, * pNodePo;
    DdNode * bSupp, * bTemp;
    char * pName;
    int i;

    // supply fake names if real names are not given
    if ( pNamePo == NULL )
        pNamePo = "F";
    if ( vNamesPi == NULL )
    {
        vNamesPiFake = Abc_NodeGetFakeNames( dd->size );
        vNamesPi = vNamesPiFake;
    }

    // make sure BDD depends on the variables whose index 
    // does not exceed the size of the array with PI names
    bSupp = Cudd_Support( dd, (DdNode *)bFunc );   Cudd_Ref( bSupp );
    for ( bTemp = bSupp; bTemp != Cudd_ReadOne(dd); bTemp = cuddT(bTemp) )
        if ( (int)Cudd_NodeReadIndex(bTemp) >= Vec_PtrSize(vNamesPi) )
            break;
    Cudd_RecursiveDeref( dd, bSupp );
    if ( bTemp != Cudd_ReadOne(dd) )
        return NULL;

    // start the network
    pNtk = Abc_NtkAlloc( ABC_NTK_LOGIC, ABC_FUNC_BDD, 1 );
    pNtk->pName = Extra_UtilStrsav(pNamePo);
    // make sure the new manager has enough inputs
    Cudd_bddIthVar( (DdManager *)pNtk->pManFunc, Vec_PtrSize(vNamesPi) );
    // add the PIs corresponding to the names
    Vec_PtrForEachEntry( char *, vNamesPi, pName, i )
        Abc_ObjAssignName( Abc_NtkCreatePi(pNtk), pName, NULL );
    // create the node
    pNode = Abc_NtkCreateNode( pNtk );
    pNode->pData = (DdNode *)Cudd_bddTransfer( dd, (DdManager *)pNtk->pManFunc, (DdNode *)bFunc ); Cudd_Ref((DdNode *)pNode->pData);
    Abc_NtkForEachPi( pNtk, pNodePi, i )
        Abc_ObjAddFanin( pNode, pNodePi );
    // create the only PO
    pNodePo = Abc_NtkCreatePo( pNtk );
    Abc_ObjAddFanin( pNodePo, pNode );
    Abc_ObjAssignName( pNodePo, pNamePo, NULL );
    // make the network minimum base
    Abc_NtkMinimumBase( pNtk );
    if ( vNamesPiFake )
        Abc_NodeFreeNames( vNamesPiFake );
    if ( !Abc_NtkCheck( pNtk ) )
        fprintf( stdout, "Abc_NtkDeriveFromBdd(): Network check has failed.\n" );
    return pNtk;
}